

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O0

void dwarfstring_destructor(dwarfstring_s *g)

{
  dwarfstring_s *g_local;
  
  if (g->s_malloc != '\0') {
    free(g->s_data);
    g->s_data = (char *)0x0;
    g->s_malloc = '\0';
  }
  dwarfstring_constructor(g);
  return;
}

Assistant:

void
dwarfstring_destructor(struct dwarfstring_s *g)
{
    if (g->s_malloc) {
        free(g->s_data);
        g->s_data   = 0;
        g->s_malloc = 0;
    }
    /*  The constructor sets all the fields, most to zero.
        s_data is set to point to static string ""
        s_malloc set to FALSE. */
    dwarfstring_constructor(g);
}